

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

RayDifferential * __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,RayDifferential *r,Float *tMax)

{
  long in_RDX;
  long in_RSI;
  RayDifferential *in_RDI;
  Transform t;
  Float *in_stack_00000108;
  RayDifferential *in_stack_00000110;
  Transform *in_stack_00000118;
  Float in_stack_0000034c;
  AnimatedTransform *in_stack_00000350;
  
  if (((*(byte *)(in_RSI + 0x108) & 1) == 0) ||
     (*(float *)(in_RDX + 0x18) <= *(float *)(in_RSI + 0x100))) {
    Transform::operator()(in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  else if (*(float *)(in_RDX + 0x18) < *(float *)(in_RSI + 0x104)) {
    Interpolate(in_stack_00000350,in_stack_0000034c);
    Transform::operator()(in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  else {
    Transform::operator()(in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU RayDifferential AnimatedTransform::operator()(const RayDifferential &r,
                                              Float *tMax) const {
    if (!actuallyAnimated || r.time <= startTime)
        return startTransform(r, tMax);
    else if (r.time >= endTime)
        return endTransform(r, tMax);
    else {
        Transform t = Interpolate(r.time);
        return t(r, tMax);
    }
}